

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# A_Star_Test.cpp
# Opt level: O3

void __thiscall
Build_Map_Node_Creation_Check_Test::TestBody(Build_Map_Node_Creation_Check_Test *this)

{
  bool bVar1;
  char *message;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  undefined1 local_98 [8];
  vector<double,_std::allocator<double>_> Points;
  long local_70;
  undefined1 auStack_68 [8];
  vector<int,_std::allocator<int>_> Test_Node;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> Built_Node;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  auStack_68 = (undefined1  [8])0x4000000000000000;
  Test_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x4000000000000000;
  Test_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x4000000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)auStack_68;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_98,__l,(allocator_type *)local_48);
  local_48 = (undefined1  [8])0x200000002;
  Built_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 2;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_48;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)auStack_68,__l_00,
             (allocator_type *)
             &Built_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &Points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_98);
  Build_Map::Build_Node
            ((vector<int,_std::allocator<int>_> *)local_48,&Map,
             (vector<double,_std::allocator<double>_> *)
             &Points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (Points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(Points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    local_70 -
                    (long)Points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)
             &Built_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"Built_Node","Test_Node",
             (vector<int,_std::allocator<int>_> *)local_48,
             (vector<int,_std::allocator<int>_> *)auStack_68);
  if ((char)Built_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage == '\0') {
    testing::Message::Message((Message *)&local_18);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/test/A_Star_Test.cpp"
               ,0x5b,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,
                    (long)Built_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_48);
  }
  if (auStack_68 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_68,
                    (long)Test_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_68);
  }
  if (local_98 != (undefined1  [8])0x0) {
    operator_delete((void *)local_98,
                    (long)Points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_98);
  }
  return;
}

Assistant:

TEST(Build_Map, Node_Creation_Check) {
  std::vector<double> Points = { 2, 2, 2 };
  std::vector<int> Test_Node = { 2, 2, 2 };
  std::vector<int> Built_Node = Map.Build_Node(Points);
  ASSERT_EQ(Built_Node, Test_Node);
}